

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O1

void __thiscall
sglr::GLContext::bindFramebuffer(GLContext *this,deUint32 target,deUint32 framebuffer)

{
  byte bVar1;
  GLuint framebuffer_00;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestError *this_00;
  int iVar3;
  int iVar4;
  GLuint local_1c;
  
  local_1c = framebuffer;
  framebuffer_00 = (*this->m_context->_vptr_RenderContext[6])();
  if (local_1c == framebuffer_00 && local_1c != 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"framebuffer == 0 || framebuffer != defaultFbo",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrGLContext.cpp"
               ,0xc6);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  bVar1 = 1;
  if ((1 < target - 0x8ca8) && (target != 0x8d40)) {
    bVar1 = 0;
  }
  if (!(bool)(bVar1 ^ 1 | local_1c == 0)) {
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&this->m_allocatedFbos,&local_1c);
  }
  if (target == 0x8d40) {
LAB_018e4cb7:
    this->m_readFramebufferBinding = local_1c;
    if ((target != 0x8d40) && (target != 0x8ca9)) goto LAB_018e4cd7;
  }
  else if (target != 0x8ca9) {
    if (target != 0x8ca8) goto LAB_018e4cd7;
    goto LAB_018e4cb7;
  }
  this->m_drawFramebufferBinding = local_1c;
LAB_018e4cd7:
  if (local_1c != 0) {
    framebuffer_00 = local_1c;
  }
  glu::CallLogWrapper::glBindFramebuffer(this->m_wrapper,target,framebuffer_00);
  if ((target == 0x8d40) || (target == 0x8ca9)) {
    iVar3 = 0;
    iVar4 = 0;
    if (this->m_drawFramebufferBinding == 0) {
      iVar3 = (this->m_baseViewport).m_data[1];
      iVar4 = (this->m_baseViewport).m_data[0];
    }
    iVar2 = (*this->m_context->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1a00))
              ((this->m_curViewport).m_data[0] + iVar4,(this->m_curViewport).m_data[1] + iVar3,
               (this->m_curViewport).m_data[2],(this->m_curViewport).m_data[3]);
    iVar2 = (*this->m_context->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x1290))
              (iVar4 + (this->m_curScissor).m_data[0],iVar3 + (this->m_curScissor).m_data[1],
               (this->m_curScissor).m_data[2],(this->m_curScissor).m_data[3]);
  }
  return;
}

Assistant:

void GLContext::bindFramebuffer (deUint32 target, deUint32 framebuffer)
{
	// \todo [2011-10-13 pyry] This is a bit of a hack since test cases assumes 0 default fbo.
	deUint32 defaultFbo = m_context.getDefaultFramebuffer();
	TCU_CHECK(framebuffer == 0 || framebuffer != defaultFbo);

	bool isValidTarget = target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER || target == GL_READ_FRAMEBUFFER;

	if (isValidTarget && framebuffer != 0)
		m_allocatedFbos.insert(framebuffer);

	// Update bindings.
	if (target == GL_FRAMEBUFFER || target == GL_READ_FRAMEBUFFER)
		m_readFramebufferBinding = framebuffer;

	if (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER)
		m_drawFramebufferBinding = framebuffer;

	if (framebuffer == 0) // Redirect 0 to platform-defined default framebuffer.
		m_wrapper->glBindFramebuffer(target, defaultFbo);
	else
		m_wrapper->glBindFramebuffer(target, framebuffer);

	// Update viewport and scissor if we updated draw framebuffer binding \note Not logged for clarity
	if (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER)
	{
		tcu::IVec2 offset = getDrawOffset();
		m_context.getFunctions().viewport(m_curViewport.x()+offset.x(), m_curViewport.y()+offset.y(), m_curViewport.z(), m_curViewport.w());
		m_context.getFunctions().scissor(m_curScissor.x()+offset.x(), m_curScissor.y()+offset.y(), m_curScissor.z(), m_curScissor.w());
	}
}